

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslcertificate.cpp
# Opt level: O1

int qRegisterNormalizedMetaType_QSslCertificate(QByteArray *name)

{
  int iVar1;
  
  iVar1 = qRegisterNormalizedMetaTypeImplementation<QSslCertificate>(name);
  return iVar1;
}

Assistant:

QSslCertificatePrivate::QSslCertificatePrivate()
{
#ifndef QT_NO_SSL
    QSslSocketPrivate::ensureInitialized();
#endif

    const QTlsBackend *tlsBackend = QTlsBackend::activeOrAnyBackend();
    if (tlsBackend)
        backend.reset(tlsBackend->createCertificate());
    else
        qCWarning(lcSsl, "No TLS backend is available");
}